

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O0

int __thiscall IZDeflate::longest_match(IZDeflate *this,IPos cur_match)

{
  short sVar1;
  uint uVar2;
  uch *puVar3;
  uint uVar4;
  uch *puVar5;
  bool bVar6;
  uint local_54;
  short local_44;
  ush scan_end;
  ush scan_start;
  uch *strend;
  uint local_30;
  IPos limit;
  int best_len;
  int len;
  uch *match;
  uch *scan;
  uint chain_length;
  IPos cur_match_local;
  IZDeflate *this_local;
  
  scan._0_4_ = this->max_chain_length;
  match = this->window + this->strstart;
  local_30 = this->prev_length;
  if (this->strstart < 0x7efb) {
    local_54 = 0;
  }
  else {
    local_54 = this->strstart - 0x7efa;
  }
  uVar2 = this->strstart;
  sVar1 = *(short *)match;
  local_44 = *(short *)(match + (long)(int)local_30 + -1);
  scan._4_4_ = cur_match;
  if (this->good_match <= this->prev_length) {
    scan._0_4_ = (uint)scan >> 2;
  }
  do {
    _best_len = this->window + scan._4_4_;
    if ((*(short *)(_best_len + (long)(int)local_30 + -1) == local_44) &&
       (*(short *)_best_len == sVar1)) {
      match = match + 1;
      _best_len = _best_len + 1;
      do {
        bVar6 = false;
        puVar3 = _best_len + 2;
        puVar5 = match + 2;
        if (*(short *)(match + 2) == *(short *)(_best_len + 2)) {
          bVar6 = false;
          puVar3 = _best_len + 4;
          puVar5 = match + 4;
          if (*(short *)(match + 4) == *(short *)(_best_len + 4)) {
            bVar6 = false;
            puVar3 = _best_len + 6;
            puVar5 = match + 6;
            if (*(short *)(match + 6) == *(short *)(_best_len + 6)) {
              puVar5 = match + 8;
              bVar6 = false;
              puVar3 = _best_len + 8;
              if (*(short *)(match + 8) == *(short *)(_best_len + 8)) {
                bVar6 = puVar5 < this->window + (ulong)uVar2 + 0x101;
              }
            }
          }
        }
        match = puVar5;
        _best_len = puVar3;
      } while (bVar6);
      if (*match == *_best_len) {
        match = match + 1;
      }
      uVar4 = 0x101 - ((int)(this->window + (ulong)uVar2 + 0x101) - (int)match);
      match = this->window + uVar2;
      if ((int)local_30 < (int)uVar4) {
        this->match_start = scan._4_4_;
        if (this->nice_match <= (int)uVar4) {
          return uVar4;
        }
        local_44 = *(short *)(this->window + (long)(int)uVar4 + (ulong)uVar2 + -1);
        local_30 = uVar4;
      }
    }
    uVar4 = scan._4_4_ & 0x7fff;
    scan._4_4_ = (IPos)this->prev[uVar4];
    bVar6 = false;
    if (local_54 <= scan._4_4_ && this->prev[uVar4] != local_54) {
      scan._0_4_ = (uint)scan - 1;
      bVar6 = (uint)scan != 0;
    }
  } while (bVar6);
  return local_30;
}

Assistant:

int IZDeflate::longest_match(IPos cur_match)
// IPos cur_match;                             /* current match */
{
    unsigned chain_length = max_chain_length; /* max hash chain length */
    uch* scan = window + strstart;            /* current string */
    uch* match;                               /* matched string */
    int len;                                  /* length of current match */
    int best_len = prev_length;               /* best match length so */
    IPos limit = strstart > (IPos)MAX_DIST ? strstart - (IPos)MAX_DIST : NIL;
    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0.
     */

/* The code is optimized for HASH_BITS >= 8 and MAX_MATCH-2 multiple of 16.
 * It is easy to get rid of this optimization if necessary.
 */
#        if HASH_BITS < 8 || MAX_MATCH != 258
error:
    Code too clever
#        endif

#        ifdef UNALIGNED_OK
        /* Compare two bytes at a time. Note: this is not always beneficial.
         * Try with and without -DUNALIGNED_OK to check.
         */
        uch* strend = window + strstart + MAX_MATCH - 1;
    ush scan_start = *(ush*)scan;
    ush scan_end = *(ush*)(scan + best_len - 1);
#        else
    uch* strend = window + strstart + MAX_MATCH;
    uch scan_end1 = scan[best_len - 1];
    uch scan_end = scan[best_len];
#        endif

    /* Do not waste too much time if we already have a good match: */
    if (prev_length >= good_match) {
        chain_length >>= 2;
    }

    Assert(strstart <= window_size - MIN_LOOKAHEAD, "insufficient lookahead");

    do {
        Assert(cur_match < strstart, "no future");
        match = window + cur_match;

        /* Skip to next match if the match length cannot increase
         * or if the match length is less than 2:
         */
#        if (defined(UNALIGNED_OK) && MAX_MATCH == 258)
        /* This code assumes sizeof(unsigned short) == 2. Do not use
         * UNALIGNED_OK if your compiler uses a different size.
         */
        if (*(ush*)(match + best_len - 1) != scan_end ||
            *(ush*)match != scan_start)
            continue;

        /* It is not necessary to compare scan[2] and match[2] since they are
         * always equal when the other bytes match, given that the hash keys
         * are equal and that HASH_BITS >= 8. Compare 2 bytes at a time at
         * strstart+3, +5, ... up to strstart+257. We check for insufficient
         * lookahead only every 4th comparison; the 128th check will be made
         * at strstart+257. If MAX_MATCH-2 is not a multiple of 8, it is
         * necessary to put more guard bytes at the end of the window, or
         * to check more often for insufficient lookahead.
         */
        scan++, match++;
        do {
        } while (*(ush*)(scan += 2) == *(ush*)(match += 2) &&
                 *(ush*)(scan += 2) == *(ush*)(match += 2) &&
                 *(ush*)(scan += 2) == *(ush*)(match += 2) &&
                 *(ush*)(scan += 2) == *(ush*)(match += 2) && scan < strend);
        /* The funny "do {}" generates better code on most compilers */

        /* Here, scan <= window+strstart+257 */
        Assert(scan <= window + (unsigned)(window_size - 1), "wild scan");
        if (*scan == *match) scan++;

        len = (MAX_MATCH - 1) - (int)(strend - scan);
        scan = strend - (MAX_MATCH - 1);

#        else /* UNALIGNED_OK */

        if (match[best_len] != scan_end || match[best_len - 1] != scan_end1 ||
            *match != *scan || *++match != scan[1])
            continue;

        /* The check at best_len-1 can be removed because it will be made
         * again later. (This heuristic is not always a win.)
         * It is not necessary to compare scan[2] and match[2] since they
         * are always equal when the other bytes match, given that
         * the hash keys are equal and that HASH_BITS >= 8.
         */
        scan += 2, match++;

        /* We check for insufficient lookahead only every 8th comparison;
         * the 256th check will be made at strstart+258.
         */
        do {
            // TODO: Vectorize?
        } while (*++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match &&
                 *++scan == *++match && *++scan == *++match && scan < strend);

        Assert(scan <= window + (unsigned)(window_size - 1), "wild scan");

        len = MAX_MATCH - (int)(strend - scan);
        scan = strend - MAX_MATCH;

#        endif /* UNALIGNED_OK */

        if (len > best_len) {
            match_start = cur_match;
            best_len = len;
            if (len >= nice_match) break;
#        ifdef UNALIGNED_OK
            scan_end = *(ush*)(scan + best_len - 1);
#        else
            scan_end1 = scan[best_len - 1];
            scan_end = scan[best_len];
#        endif
        }
    } while ((cur_match = prev[cur_match & WMASK]) > limit &&
             --chain_length != 0);

    return best_len;
}